

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  long lVar2;
  int c;
  long lVar3;
  float *this;
  Matrix<float,_2,_2> retVal;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  undefined1 local_58 [16];
  int local_48;
  Vector<float,_3> local_3c;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_60.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector
              (&local_60,(Vector<float,_2> *)sr::(anonymous_namespace)::s_constInVec2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_68.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector
              (&local_68,(Vector<float,_2> *)(sr::(anonymous_namespace)::s_constInVec2 + 8));
  }
  this = (float *)local_58;
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar1 = local_68.m_data[lVar2];
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      this[lVar3 * 2] = local_60.m_data[lVar3] * fVar1;
    }
    this = this + 1;
  }
  tcu::transpose<float,2,2>((tcu *)&local_30,(Matrix<float,_2,_2> *)local_58);
  local_3c.m_data[2] = local_2c + local_24;
  local_3c.m_data[0] = local_30;
  local_3c.m_data[1] = local_28;
  local_58._0_8_ = &evalCtx->color;
  local_58._8_4_ = 0.0;
  local_58._12_4_ = 1.4013e-45;
  local_48 = 2;
  tcu::VecAccess<float,_4,_3>::operator=((VecAccess<float,_4,_3> *)local_58,&local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}